

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::ContributeGlobalDiagonal
          (TPZDohrSubstruct<std::complex<float>_> *this,
          TPZFMatrix<std::complex<float>_> *StiffnessDiag)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  TPZMatrix<std::complex<float>_> *pTVar3;
  pair<int,_int> *ppVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  
  TPZManVector<std::complex<float>,_10>::Resize(&this->fWeights,(long)this->fNEquations);
  if (0 < this->fNEquations) {
    lVar7 = 0;
    do {
      pTVar3 = ((this->fStiffness).fRef)->fPointer;
      if (((pTVar3->super_TPZBaseMatrix).fRow <= lVar7) ||
         ((pTVar3->super_TPZBaseMatrix).fCol <= lVar7)) {
        TPZMatrix<std::complex<float>_>::Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar5 = (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (pTVar3,lVar7,lVar7);
      (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar7]._M_value =
           *(_ComplexT *)CONCAT44(extraout_var,iVar5);
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->fNEquations);
  }
  if (fWeightType == CorrectWeight) {
    if (0 < this->fNEquations) {
      lVar7 = 0;
      do {
        pTVar3 = ((this->fStiffness).fRef)->fPointer;
        if (((pTVar3->super_TPZBaseMatrix).fRow <= lVar7) ||
           ((pTVar3->super_TPZBaseMatrix).fCol <= lVar7)) {
          TPZMatrix<std::complex<float>_>::Error("TPZMatrix<TVar>::Operator()","Index out of range")
          ;
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                     ,0x33d);
        }
        iVar5 = (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (pTVar3,lVar7,lVar7);
        (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar7]._M_value =
             *(_ComplexT *)CONCAT44(extraout_var_00,iVar5);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->fNEquations);
    }
    if (0 < (this->fCoarseNodes).fNElements) {
      lVar7 = 0;
      do {
        if (((this->fKCi).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar7)
           || ((this->fKCi).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol <= lVar7)
           ) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (this->fWeights).super_TPZVec<std::complex<float>_>.fStore
        [(this->fCoarseNodes).fStore[lVar7]]._M_value =
             (this->fKCi).fElem
             [(this->fKCi).super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow * lVar7 +
              lVar7]._M_value;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->fCoarseNodes).fNElements);
    }
  }
  else {
    if (0 < this->fNEquations) {
      lVar7 = 0;
      do {
        (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar7]._M_value = 0x3f800000;
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->fNEquations);
    }
    if (0 < (this->fCoarseNodes).fNElements) {
      lVar7 = 0;
      do {
        (this->fWeights).super_TPZVec<std::complex<float>_>.fStore
        [(this->fCoarseNodes).fStore[lVar7]]._M_value = 0x3f800000;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->fCoarseNodes).fNElements);
    }
  }
  uVar6 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      ppVar4 = (this->fGlobalEqs).fStore;
      lVar7 = (long)ppVar4[uVar8].second;
      if (((lVar7 < 0) ||
          ((StiffnessDiag->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar7)
          ) || ((StiffnessDiag->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)
         ) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      _Var1 = (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[ppVar4[uVar8].first].
              _M_value;
      _Var2 = StiffnessDiag->fElem[lVar7]._M_value;
      StiffnessDiag->fElem[lVar7]._M_value =
           CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
      uVar8 = uVar8 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar8);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeGlobalDiagonal(TPZFMatrix<TVar> &StiffnessDiag) {
	int i;
	fWeights.Resize(fNEquations);
	//fWeights = diag(kci) if u(i) is on coarse or diag(Ki)
	for (i=0;i<fNEquations;i++) {
		fWeights[i] = fStiffness->operator()(i,i);
	}
	if(fWeightType == CorrectWeight)
	{
		for (i=0;i<fNEquations;i++) {
			fWeights[i] = fStiffness->operator()(i,i);
		}
		for (i=0;i<fCoarseNodes.NElements();i++) {
			fWeights[fCoarseNodes[i]] = fKCi(i,i);
		}
	} else {
		for (i=0;i<fNEquations;i++) {
			fWeights[i] = 1.;
		}
		for (i=0;i<fCoarseNodes.NElements();i++) {
			fWeights[fCoarseNodes[i]] = 1.;
		}
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weight used for assembly" << fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		StiffnessDiag(ind.second,0) += fWeights[ind.first];
	}
}